

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

int NGA_Create_ghosts_irreg_config
              (int type,int ndim,int *dims,int *width,char *name,int *block,int *map,int p_handle)

{
  Integer *map_00;
  logical lVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  ulong ndim_00;
  Integer g_a;
  Integer _ga_width [7];
  Integer _ga_work [7];
  Integer _ga_dims [7];
  
  if (7 < ndim) {
    return 0;
  }
  if (0 < ndim) {
    ndim_00 = (ulong)(uint)ndim;
    uVar3 = ndim_00;
    do {
      _ga_dims[uVar3 - 1] = (long)*dims;
      dims = dims + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    uVar3 = ndim_00;
    piVar4 = block;
    if (0 < ndim) {
      do {
        _ga_work[uVar3 - 1] = (long)*piVar4;
        uVar3 = uVar3 - 1;
        piVar4 = piVar4 + 1;
      } while (uVar3 != 0);
      uVar3 = ndim_00;
      if (0 < ndim) {
        do {
          _ga_width[uVar3 - 1] = (long)*width;
          width = width + 1;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
        goto LAB_00104869;
      }
    }
  }
  ndim_00 = (ulong)ndim;
LAB_00104869:
  map_00 = copy_map(block,ndim,map);
  _ga_irreg_flag = 1;
  lVar1 = pnga_create_ghosts_irreg_config
                    ((long)type,ndim_00,_ga_dims,_ga_width,name,map_00,_ga_work,(long)p_handle,&g_a)
  ;
  _ga_irreg_flag = 0;
  free(map_00);
  iVar2 = 0;
  if (lVar1 == 1) {
    iVar2 = (int)g_a;
  }
  return iVar2;
}

Assistant:

int NGA_Create_ghosts_irreg_config(int type, int ndim, int dims[], int width[], char *name, int block[], int map[], int p_handle)
{
    Integer g_a;
    logical st;
    Integer _ga_dims[MAXDIM];
    Integer _ga_work[MAXDIM];
    Integer _ga_width[MAXDIM];
    Integer *_ga_map_capi;
    if(ndim>MAXDIM)return 0;

    COPYC2F(dims,_ga_dims, ndim);
    COPYC2F(block,_ga_work, ndim);
    COPYC2F(width,_ga_width, ndim);
    _ga_map_capi = copy_map(block, ndim, map);

    _ga_irreg_flag = 1; /* set this flag=1, to indicate array is irregular */
    st = wnga_create_ghosts_irreg_config(type, (Integer)ndim, _ga_dims,
					 _ga_width, name, _ga_map_capi, _ga_work, 
					 (Integer)p_handle, &g_a);
    _ga_irreg_flag = 0; /* unset it, after creating array */ 

    free(_ga_map_capi);
    if(st==TRUE) return (int) g_a;
    else return 0;
}